

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pFVar1;
  string *psVar2;
  Allocator **ppAVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  ulong uVar7;
  undefined4 uVar10;
  ulong uVar8;
  undefined4 uVar11;
  char *pcVar12;
  int iVar13;
  int *piVar14;
  bool bVar15;
  size_t *psVar16;
  char cVar17;
  int iVar18;
  float *pfVar19;
  size_t sVar20;
  Mat *pMVar21;
  uint uVar22;
  int iVar23;
  pointer pFVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  int baseLine;
  Size label_size;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  Mat image;
  Net retinaface;
  Mat m;
  undefined1 local_468 [16];
  Mat local_458;
  Mat local_408;
  Mat local_3b8;
  undefined1 local_368 [16];
  pointer local_358;
  vector<FaceObject,_std::allocator<FaceObject>_> local_348;
  int local_32c;
  undefined1 local_328 [32];
  Allocator *local_308;
  int iStack_300;
  int iStack_2fc;
  undefined8 uStack_2f8;
  int local_2f0;
  size_t local_2e8;
  undefined1 local_2d8 [32];
  Allocator *local_2b8;
  int iStack_2b0;
  int iStack_2ac;
  undefined8 uStack_2a8;
  int local_2a0;
  size_t local_298;
  Mat local_288;
  int local_240;
  int local_23c;
  undefined1 local_238 [16];
  pointer local_228;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  Mat local_1f8;
  Net local_198 [3];
  string local_90 [8];
  ulong local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar12 = argv[1];
    std::__cxx11::string::string((string *)local_198,pcVar12,(allocator *)&local_1f8);
    cv::imread(local_90,(int)local_198);
    if ((Allocator **)local_198[0]._vptr_Net != &local_198[0].opt.blob_allocator) {
      operator_delete(local_198[0]._vptr_Net);
    }
    cVar17 = cv::Mat::empty();
    if (cVar17 == '\0') {
      local_238 = (undefined1  [16])0x0;
      local_228 = (pointer)0x0;
      ncnn::Net::Net(local_198);
      local_198[0].opt.use_vulkan_compute = true;
      iVar18 = ncnn::Net::load_param(local_198,"mnet.25-opt.param");
      if ((iVar18 != 0) ||
         (iVar18 = ncnn::Net::load_model(local_198,"mnet.25-opt.bin"), iVar18 != 0)) {
        exit(-1);
      }
      local_208 = local_88;
      uStack_200 = 0;
      ncnn::Mat::from_pixels
                (&local_1f8,local_80,0x10002,(int)(local_88 >> 0x20),(int)local_88,(Allocator *)0x0)
      ;
      ncnn::Net::create_extractor((Net *)local_468);
      ncnn::Extractor::input((Extractor *)local_468,"data",&local_1f8);
      local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458.cstep = 0;
      local_458.data._0_4_ = 0;
      local_458.data._4_4_ = 0;
      local_458.refcount._0_4_ = 0;
      local_458.refcount._4_4_ = 0;
      local_458.elemsize = 0;
      local_458.elempack = 0;
      local_458.allocator = (Allocator *)0x0;
      local_458.dims = 0;
      local_458.w = 0;
      local_458.h = 0;
      local_458.d = 0;
      local_458.c = 0;
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.allocator = (Allocator *)0x0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.allocator = (Allocator *)0x0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      ncnn::Extractor::extract
                ((Extractor *)local_468,"face_rpn_cls_prob_reshape_stride32",
                 (Mat *)(local_468 + 0x10),0);
      ncnn::Extractor::extract((Extractor *)local_468,"face_rpn_bbox_pred_stride32",&local_408,0);
      ncnn::Extractor::extract
                ((Extractor *)local_468,"face_rpn_landmark_pred_stride32",&local_3b8,0);
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_308 = (Allocator *)0x0;
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      ncnn::Mat::create((Mat *)local_328,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_328._4_4_,local_328._0_4_) = 0x3f800000;
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2b8 = (Allocator *)0x0;
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2d8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) = 0x4180000042000000;
      generate_anchors(&local_288,(int)local_328,(Mat *)local_2d8,pMVar21);
      local_368 = (undefined1  [16])0x0;
      local_358 = (pointer)0x0;
      generate_proposals(&local_288,0x20,(Mat *)(local_468 + 0x10),&local_408,&local_3b8,0.0,
                         (vector<FaceObject,_std::allocator<FaceObject>_> *)local_368);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_348,
                 local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_368._0_8_);
      if ((pointer)local_368._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_368._0_8_);
      }
      if (local_288.refcount != (int *)0x0) {
        LOCK();
        *local_288.refcount = *local_288.refcount + -1;
        UNLOCK();
        if (*local_288.refcount == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data) != (void *)0x0) {
              free((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data));
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_2b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_));
            }
          }
          else {
            (*local_2b8->_vptr_Allocator[3])();
          }
        }
      }
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      piVar14 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_308 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_328._4_4_,local_328._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_328._4_4_,local_328._0_4_));
            }
          }
          else {
            (*local_308->_vptr_Allocator[3])();
          }
        }
      }
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      piVar14 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data));
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      piVar14 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_408.allocator == (Allocator *)0x0) {
            if (local_408.data != (void *)0x0) {
              free(local_408.data);
            }
          }
          else {
            (*(local_408.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      piVar14 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_458.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_));
            }
          }
          else {
            (*(local_458.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_458.cstep = 0;
      local_458.data._0_4_ = 0;
      local_458.data._4_4_ = 0;
      local_458.refcount._0_4_ = 0;
      local_458.refcount._4_4_ = 0;
      local_458.elemsize = 0;
      local_458.elempack = 0;
      local_458.allocator = (Allocator *)0x0;
      local_458.dims = 0;
      local_458.w = 0;
      local_458.h = 0;
      local_458.d = 0;
      local_458.c = 0;
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.allocator = (Allocator *)0x0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.allocator = (Allocator *)0x0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      ncnn::Extractor::extract
                ((Extractor *)local_468,"face_rpn_cls_prob_reshape_stride16",
                 (Mat *)(local_468 + 0x10),0);
      ncnn::Extractor::extract((Extractor *)local_468,"face_rpn_bbox_pred_stride16",&local_408,0);
      ncnn::Extractor::extract
                ((Extractor *)local_468,"face_rpn_landmark_pred_stride16",&local_3b8,0);
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_308 = (Allocator *)0x0;
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      ncnn::Mat::create((Mat *)local_328,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_328._4_4_,local_328._0_4_) = 0x3f800000;
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2b8 = (Allocator *)0x0;
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2d8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) = 0x4080000041000000;
      generate_anchors(&local_288,(int)local_328,(Mat *)local_2d8,pMVar21);
      local_368 = (undefined1  [16])0x0;
      local_358 = (pointer)0x0;
      generate_proposals(&local_288,0x10,(Mat *)(local_468 + 0x10),&local_408,&local_3b8,0.0,
                         (vector<FaceObject,_std::allocator<FaceObject>_> *)local_368);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_348,
                 local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_368._0_8_);
      if ((pointer)local_368._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_368._0_8_);
      }
      if (local_288.refcount != (int *)0x0) {
        LOCK();
        *local_288.refcount = *local_288.refcount + -1;
        UNLOCK();
        if (*local_288.refcount == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data) != (void *)0x0) {
              free((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data));
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_2b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_));
            }
          }
          else {
            (*local_2b8->_vptr_Allocator[3])();
          }
        }
      }
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      piVar14 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_308 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_328._4_4_,local_328._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_328._4_4_,local_328._0_4_));
            }
          }
          else {
            (*local_308->_vptr_Allocator[3])();
          }
        }
      }
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      piVar14 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data));
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      piVar14 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_408.allocator == (Allocator *)0x0) {
            if (local_408.data != (void *)0x0) {
              free(local_408.data);
            }
          }
          else {
            (*(local_408.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      piVar14 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_458.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_));
            }
          }
          else {
            (*(local_458.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_458.cstep = 0;
      local_458.data._0_4_ = 0;
      local_458.data._4_4_ = 0;
      local_458.refcount._0_4_ = 0;
      local_458.refcount._4_4_ = 0;
      local_458.elemsize = 0;
      local_458.elempack = 0;
      local_458.allocator = (Allocator *)0x0;
      local_458.dims = 0;
      local_458.w = 0;
      local_458.h = 0;
      local_458.d = 0;
      local_458.c = 0;
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.allocator = (Allocator *)0x0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.allocator = (Allocator *)0x0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      ncnn::Extractor::extract
                ((Extractor *)local_468,"face_rpn_cls_prob_reshape_stride8",
                 (Mat *)(local_468 + 0x10),0);
      ncnn::Extractor::extract((Extractor *)local_468,"face_rpn_bbox_pred_stride8",&local_408,0);
      ncnn::Extractor::extract((Extractor *)local_468,"face_rpn_landmark_pred_stride8",&local_3b8,0)
      ;
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_308 = (Allocator *)0x0;
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      ncnn::Mat::create((Mat *)local_328,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_328._4_4_,local_328._0_4_) = 0x3f800000;
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2b8 = (Allocator *)0x0;
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      pMVar21 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2d8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) = 0x3f80000040000000;
      generate_anchors(&local_288,(int)local_328,(Mat *)local_2d8,pMVar21);
      local_368 = (undefined1  [16])0x0;
      local_358 = (pointer)0x0;
      generate_proposals(&local_288,8,(Mat *)(local_468 + 0x10),&local_408,&local_3b8,0.0,
                         (vector<FaceObject,_std::allocator<FaceObject>_> *)local_368);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&local_348,
                 local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_368._0_8_,local_368._8_8_);
      if ((pointer)local_368._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_368._0_8_);
      }
      if (local_288.refcount != (int *)0x0) {
        LOCK();
        *local_288.refcount = *local_288.refcount + -1;
        UNLOCK();
        if (*local_288.refcount == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data) != (void *)0x0) {
              free((void *)CONCAT44(local_288.data._4_4_,(int)local_288.data));
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_2b8 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_));
            }
          }
          else {
            (*local_2b8->_vptr_Allocator[3])();
          }
        }
      }
      local_298 = 0;
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2d8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_2b0 = 0;
      iStack_2ac = 0;
      uStack_2a8._0_4_ = 0;
      uStack_2a8._4_4_ = 0;
      local_2a0 = 0;
      piVar14 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_308 == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_328._4_4_,local_328._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_328._4_4_,local_328._0_4_));
            }
          }
          else {
            (*local_308->_vptr_Allocator[3])();
          }
        }
      }
      local_2e8 = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._16_12_ = SUB1612((undefined1  [16])0x0,4);
      iStack_300 = 0;
      iStack_2fc = 0;
      uStack_2f8._0_4_ = 0;
      uStack_2f8._4_4_ = 0;
      local_2f0 = 0;
      piVar14 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_3b8.data._4_4_,(int)local_3b8.data));
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_3b8.cstep = 0;
      local_3b8.data._0_4_ = 0;
      local_3b8.data._4_4_ = 0;
      local_3b8.refcount._0_4_ = 0;
      local_3b8.refcount._4_4_ = 0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.dims = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      piVar14 = (int *)CONCAT44(local_408.refcount._4_4_,local_408.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_408.allocator == (Allocator *)0x0) {
            if (local_408.data != (void *)0x0) {
              free(local_408.data);
            }
          }
          else {
            (*(local_408.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_408.cstep = 0;
      local_408.data = (void *)0x0;
      local_408.refcount._0_4_ = 0;
      local_408.refcount._4_4_ = 0;
      local_408.elemsize = 0;
      local_408.elempack = 0;
      local_408.dims = 0;
      local_408.w = 0;
      local_408.h = 0;
      local_408.d = 0;
      local_408.c = 0;
      piVar14 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_458.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_));
            }
          }
          else {
            (*(local_458.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_458.cstep = 0;
      local_458.data._0_4_ = 0;
      local_458.data._4_4_ = 0;
      local_458.refcount._0_4_ = 0;
      local_458.refcount._4_4_ = 0;
      local_458.elemsize = 0;
      local_458.elempack = 0;
      local_458.dims = 0;
      local_458.w = 0;
      local_458.h = 0;
      local_458.d = 0;
      local_458.c = 0;
      if (local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&local_348,0,
                   (int)((ulong)((long)local_348.
                                       super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_348.
                                      super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x11111111
                   + -1);
      }
      local_408.data = (void *)0x0;
      local_408.elemsize = 0;
      local_408.refcount._4_4_ = 0;
      local_408.refcount._0_4_ = 0;
      uVar28 = (int)((long)local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2) * -0x11111111;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(local_468 + 0x10),(long)(int)uVar28,
                 (allocator_type *)&local_3b8);
      if ((int)uVar28 < 1) {
        local_3b8.data._0_4_ = 0;
      }
      else {
        pfVar19 = &((local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar25 = 0;
        do {
          *(float *)(CONCAT44(local_458.data._4_4_,local_458.data._0_4_) + uVar25 * 4) =
               pfVar19[-1] * *pfVar19;
          uVar25 = uVar25 + 1;
          pfVar19 = pfVar19 + 0xf;
        } while ((uVar28 & 0x7fffffff) != uVar25);
        local_3b8.data._0_4_ = 0;
        do {
          uVar22 = (uint)((ulong)((long)local_408.refcount - (long)local_408.data) >> 2);
          if ((int)uVar22 < 1) {
LAB_00127e68:
            if (local_408.refcount == (int *)local_408.elemsize) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_408,(iterator)local_408.refcount,
                         (int *)&local_3b8);
            }
            else {
              *local_408.refcount = (int)local_3b8.data;
              local_408.refcount = local_408.refcount + 1;
            }
          }
          else {
            lVar26 = (long)(int)local_3b8.data;
            uVar25._0_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar26].rect.x;
            uVar25._4_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar26].rect.y;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar25;
            uVar4 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar26].rect.width;
            uVar9 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar26].rect.height;
            auVar32._0_4_ = (float)uVar4 + (float)(undefined4)uVar25;
            auVar32._4_4_ = (float)uVar9 + (float)uVar25._4_4_;
            auVar32._8_8_ = 0;
            bVar15 = true;
            uVar25 = 0;
            do {
              lVar27 = (long)*(int *)((long)local_408.data + uVar25 * 4);
              uVar7._0_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar27].rect.x;
              uVar7._4_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar27].rect.y;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar7;
              uVar5 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27].rect.width;
              uVar10 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar27].rect.height;
              auVar35._0_4_ = (float)uVar5 + (float)(undefined4)uVar7;
              auVar35._4_4_ = (float)uVar10 + (float)uVar7._4_4_;
              auVar35._8_8_ = 0;
              auVar40 = maxps(auVar40,auVar37);
              auVar35 = minps(auVar35,auVar32);
              fVar33 = auVar35._0_4_ - auVar40._0_4_;
              fVar39 = auVar35._4_4_ - auVar40._4_4_;
              fVar34 = 0.0;
              if (0.0 < fVar39 && 0.0 < fVar33) {
                fVar34 = fVar33 * fVar39;
              }
              if (0.4 < fVar34 / ((*(float *)(CONCAT44(local_458.data._4_4_,local_458.data._0_4_) +
                                             lVar27 * 4) +
                                  *(float *)(CONCAT44(local_458.data._4_4_,local_458.data._0_4_) +
                                            lVar26 * 4)) - fVar34)) {
                bVar15 = false;
              }
              uVar25 = uVar25 + 1;
            } while ((uVar22 & 0x7fffffff) != uVar25);
            if (bVar15) goto LAB_00127e68;
          }
          local_3b8.data._0_4_ = (int)local_3b8.data + 1;
        } while ((int)local_3b8.data < (int)uVar28);
      }
      if ((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_));
      }
      uVar28 = (uint)((ulong)((long)local_408.refcount - (long)local_408.data) >> 2);
      std::vector<FaceObject,_std::allocator<FaceObject>_>::resize
                ((vector<FaceObject,_std::allocator<FaceObject>_> *)local_238,(long)(int)uVar28);
      if (0 < (int)uVar28) {
        uVar29 = CONCAT44((float)(int)local_208 + -1.0,(float)local_208._4_4_ + -1.0);
        uVar25 = 0;
        pFVar24 = (pointer)local_238._0_8_;
        do {
          iVar18 = *(int *)((long)local_408.data + uVar25 * 4);
          pFVar1 = (pointer)(local_238._0_8_ + uVar25 * 0x3c);
          uVar8._0_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar18].rect.x;
          uVar8._4_4_ = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar18].rect.y;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar8;
          (((pointer)(local_238._0_8_ + uVar25 * 0x3c))->rect).x = (float)(undefined4)uVar8;
          (((pointer)(local_238._0_8_ + uVar25 * 0x3c))->rect).y = (float)uVar8._4_4_;
          uVar6 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18].rect.width;
          uVar11 = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18].rect.height;
          (((pointer)(local_238._0_8_ + uVar25 * 0x3c))->rect).width = (float)uVar6;
          (((pointer)(local_238._0_8_ + uVar25 * 0x3c))->rect).height = (float)uVar11;
          lVar26 = 2;
          do {
            pFVar24->landmark[lVar26 + -2] =
                 local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar18].landmark[lVar26 + -2];
            lVar26 = lVar26 + 1;
          } while (lVar26 != 7);
          pFVar1->prob = local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar18].prob;
          auVar36._8_4_ = (float)(int)uStack_200 + 0.0;
          auVar36._0_8_ = uVar29;
          auVar36._12_4_ = (float)uStack_200._4_4_ + 0.0;
          auVar37 = minps(auVar36,auVar31);
          auVar30._0_4_ = (float)uVar6 + (float)(undefined4)uVar8;
          auVar30._4_4_ = (float)uVar11 + (float)uVar8._4_4_;
          auVar30._8_8_ = 0;
          auVar32 = maxps(ZEXT816(0),auVar37);
          auVar38._8_4_ = (float)(int)uStack_200 + 0.0;
          auVar38._0_8_ = uVar29;
          auVar38._12_4_ = (float)uStack_200._4_4_ + 0.0;
          auVar37 = minps(auVar38,auVar30);
          auVar37 = maxps(ZEXT816(0),auVar37);
          (pFVar1->rect).x = (float)(int)auVar32._0_8_;
          (pFVar1->rect).y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
          (pFVar1->rect).width = auVar37._0_4_ - auVar32._0_4_;
          (pFVar1->rect).height = auVar37._4_4_ - auVar32._4_4_;
          uVar25 = uVar25 + 1;
          pFVar24 = pFVar24 + 1;
        } while (uVar25 != (uVar28 & 0x7fffffff));
      }
      if (local_408.data != (void *)0x0) {
        operator_delete(local_408.data);
      }
      if (local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor((Extractor *)local_468);
      piVar14 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(local_198);
      cv::Mat::clone();
      psVar16 = (size_t *)CONCAT44(local_458.data._4_4_,local_458.data._0_4_);
      if (local_238._8_8_ != local_238._0_8_) {
        lVar26 = 0;
        uVar25 = 0;
        pFVar24 = (pointer)local_238._0_8_;
        do {
          local_208 = uVar25;
          local_458.data = psVar16;
          fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)(pFVar24->landmark + 5) + lVar26),
                  (double)*(float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x +
                                    lVar26),
                  (double)*(float *)((long)pFVar24->landmark + lVar26 + -0xc),
                  (double)*(float *)((long)(pFVar24->landmark + -1) + lVar26),
                  (double)*(float *)((long)pFVar24->landmark + lVar26 + -4));
          local_458.elemsize = 0;
          psVar2 = (string *)(local_468 + 0x10);
          local_458.data._0_4_ = 0x3010000;
          local_328._0_4_ =
               (undefined4)
               ROUND(*(float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x + lVar26))
          ;
          local_328._4_4_ = (undefined4)ROUND(*(float *)((long)pFVar24->landmark + lVar26 + -0xc));
          local_328._8_4_ = (undefined4)ROUND(*(float *)((long)(pFVar24->landmark + -1) + lVar26));
          local_328._12_4_ = (undefined4)ROUND(*(float *)((long)pFVar24->landmark + lVar26 + -4));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x0;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::rectangle(psVar2,local_328,local_198,1,8,0);
          local_458.elemsize = 0;
          local_458.data._0_4_ = 0x3010000;
          local_288.data._0_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[0].x + lVar26));
          local_288.data._4_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[0].y + lVar26));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::circle(psVar2,&local_288,2,local_198,0xffffffff,8,0);
          local_458.elemsize = 0;
          local_458.data._0_4_ = 0x3010000;
          local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[1].y + lVar26));
          local_348.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&pFVar24->landmark[1].x + lVar26));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::circle(psVar2,&local_348,2,local_198,0xffffffff,8,0);
          local_458.elemsize = 0;
          local_458.data._0_4_ = 0x3010000;
          local_368._4_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[2].y + lVar26));
          local_368._0_4_ = (int)ROUND(*(float *)((long)&pFVar24->landmark[2].x + lVar26));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::circle(psVar2,local_368,2,local_198,0xffffffff,8,0);
          local_458.elemsize = 0;
          local_458.data._0_4_ = 0x3010000;
          local_468._0_4_ = (undefined4)ROUND(*(float *)((long)&pFVar24->landmark[3].x + lVar26));
          local_468._4_4_ = (undefined4)ROUND(*(float *)((long)&pFVar24->landmark[3].y + lVar26));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::circle(psVar2,local_468,2,local_198,0xffffffff,8,0);
          local_458.elemsize = 0;
          local_458.data._0_4_ = 0x3010000;
          local_210 = (int)ROUND(*(float *)((long)&pFVar24->landmark[4].x + lVar26));
          local_20c = (int)ROUND(*(float *)((long)&pFVar24->landmark[4].y + lVar26));
          local_198[0]._vptr_Net = (_func_int **)0x0;
          local_198[0].opt.lightmode = false;
          local_198[0].opt.use_shader_pack8 = false;
          local_198[0].opt.use_subgroup_ops = false;
          local_198[0].opt.use_reserved_0 = false;
          local_198[0].opt.num_threads = 0x406fe000;
          local_198[0].opt.blob_allocator = (Allocator *)0x406fe00000000000;
          local_198[0].opt.workspace_allocator = (Allocator *)0x0;
          local_458.refcount = (int *)&local_1f8;
          cv::circle(psVar2,&local_210,2,local_198,0xffffffff,8,0);
          sprintf((char *)local_198,"%.1f%%",
                  (double)(*(float *)((long)(pFVar24->landmark + 5) + lVar26) * 100.0));
          local_32c = 0;
          local_458.data = &local_458.elemsize;
          sVar20 = strlen((char *)local_198);
          std::__cxx11::string::_M_construct<char_const*>
                    (psVar2,local_198,(long)&local_198[0]._vptr_Net + sVar20);
          cv::getTextSize((string *)&local_240,(int)psVar2,0.5,0,(int *)0x1);
          if ((size_t *)local_458.data != &local_458.elemsize) {
            operator_delete(local_458.data);
          }
          iVar18 = (int)*(float *)((long)&(((FaceObject *)(pFVar24->landmark + -2))->rect).x +
                                  lVar26);
          iVar23 = (int)((*(float *)((long)pFVar24->landmark + lVar26 + -0xc) - (float)local_23c) -
                        (float)local_32c);
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          iVar13 = local_1f8.refcount._4_4_ - local_240;
          if (local_240 + iVar18 <= local_1f8.refcount._4_4_) {
            iVar13 = iVar18;
          }
          local_3b8.elemsize = 0;
          local_3b8.data._0_4_ = 0x3010000;
          local_2d8._12_4_ = local_32c + local_23c;
          local_2d8._8_4_ = local_240;
          local_458.data._0_4_ = 0;
          local_458.data._4_4_ = 0x406fe000;
          local_458.refcount._0_4_ = 0;
          local_458.refcount._4_4_ = 0x406fe000;
          local_458.elemsize = 0x406fe00000000000;
          local_458.elempack = 0;
          local_458._28_4_ = 0;
          psVar2 = (string *)(local_468 + 0x10);
          local_2d8._0_4_ = iVar13;
          local_2d8._4_4_ = iVar23;
          local_3b8.refcount = (int *)&local_1f8;
          cv::rectangle(&local_3b8,local_2d8,psVar2,0xffffffff,8,0);
          local_3b8.elemsize = 0;
          local_3b8.data._0_4_ = 0x3010000;
          local_458.data = &local_458.elemsize;
          local_3b8.refcount = (int *)&local_1f8;
          sVar20 = strlen((char *)local_198);
          std::__cxx11::string::_M_construct<char_const*>
                    (psVar2,local_198,(long)&local_198[0]._vptr_Net + sVar20);
          local_214 = iVar23 + local_23c;
          local_408.data = (void *)0x0;
          local_408.refcount._0_4_ = 0;
          local_408.refcount._4_4_ = 0;
          local_408.elemsize = 0;
          local_408.elempack = 0;
          local_408._28_4_ = 0;
          local_218 = iVar13;
          cv::putText(0x3fe0000000000000,&local_3b8,psVar2,&local_218,0,&local_408,1,8,0);
          uVar25 = local_208;
          psVar16 = (size_t *)local_458.data;
          if ((size_t *)local_458.data != &local_458.elemsize) {
            operator_delete(local_458.data);
            psVar16 = (size_t *)local_458.data;
          }
          local_458.data._4_4_ = (undefined4)((ulong)psVar16 >> 0x20);
          uVar25 = uVar25 + 1;
          lVar26 = lVar26 + 0x3c;
          pFVar24 = (pointer)local_238._0_8_;
        } while (uVar25 < (ulong)(((long)(local_238._8_8_ - local_238._0_8_) >> 2) *
                                 -0x1111111111111111));
      }
      ppAVar3 = &local_198[0].opt.blob_allocator;
      local_198[0].opt.blob_allocator =
           (Allocator *)CONCAT26(local_198[0].opt.blob_allocator._6_2_,0x6567616d69);
      local_198[0].opt.lightmode = true;
      local_198[0].opt.use_shader_pack8 = false;
      local_198[0].opt.use_subgroup_ops = false;
      local_198[0].opt.use_reserved_0 = false;
      local_198[0].opt.num_threads = 0;
      local_458.elemsize = 0;
      local_458.data._0_4_ = 0x1010000;
      local_458.refcount = (int *)&local_1f8;
      local_198[0]._vptr_Net = (_func_int **)ppAVar3;
      cv::imshow((string *)local_198,(_InputArray *)(local_468 + 0x10));
      if ((Allocator **)local_198[0]._vptr_Net != ppAVar3) {
        operator_delete(local_198[0]._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&local_1f8);
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      iVar18 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar12);
      iVar18 = -1;
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  else {
    main_cold_1();
    iVar18 = -1;
  }
  return iVar18;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_retinaface(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}